

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O3

string * ovf::detail::write::top_header_string_abi_cxx11_(void)

{
  string *in_RDI;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  string padding;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  undefined1 *local_258;
  undefined8 uStack_250;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"# OOMMF OVF 2.0\n","");
  std::__cxx11::string::_M_append((char *)in_RDI,empty_line_abi_cxx11_);
  local_278 = local_268;
  std::__cxx11::string::_M_construct((ulong)&local_278,'\x06');
  local_258 = local_278;
  uStack_250 = uStack_270;
  local_238 = 0;
  local_248 = &PTR_grow_00178c20;
  local_230 = 500;
  format_str.size_ = 0x14;
  format_str.data_ = "# Segment count: {}\n";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string>
                ::TYPES;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args);
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,local_240,local_240 + local_238);
  local_248 = &PTR_grow_00178c20;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_298[0]);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0]);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  return in_RDI;
}

Assistant:

inline std::string top_header_string()
    {
        std::string ret = "# OOMMF OVF 2.0\n";
        ret += empty_line;

        // create padding string
        std::string padding( n_segments_str_digits, '0' );
        // write padding plus n_segments
        ret += fmt::format( "# Segment count: {}\n", padding );

        return ret;
    }